

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

bool obj_check(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = is_trusted(ch,0x38);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = is_trusted(ch,0x37);
    if (((!bVar1) || (0x14 < obj->level)) || (1000 < obj->cost)) {
      bVar1 = is_trusted(ch,0x36);
      if (((!bVar1) || (10 < obj->level)) || (500 < obj->cost)) {
        bVar1 = is_trusted(ch,0x35);
        if (((!bVar1) || (5 < obj->level)) || (0xfa < obj->cost)) {
          bVar1 = is_trusted(ch,0x34);
          if (((!bVar1) || (obj->level != 0)) || (100 < obj->cost)) {
            bVar2 = false;
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool obj_check(CHAR_DATA *ch, OBJ_DATA *obj)
{
	if (is_trusted(ch, GOD)
		|| (is_trusted(ch, IMMORTAL) && obj->level <= 20 && obj->cost <= 1000)
		|| (is_trusted(ch, DEMI) && obj->level <= 10 && obj->cost <= 500)
		|| (is_trusted(ch, ANGEL) && obj->level <= 5 && obj->cost <= 250)
		|| (is_trusted(ch, AVATAR) && obj->level == 0 && obj->cost <= 100))
		return true;
	else
		return false;
}